

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-ni.c
# Opt level: O0

ssh_hash * sha1_ni_new(ssh_hashalg *alg)

{
  _Bool _Var1;
  sha1_ni *psVar2;
  sha1_ni *s;
  sha1_extra *extra;
  ssh_hashalg *alg_local;
  
  _Var1 = check_availability((sha1_extra *)alg->extra);
  if (_Var1) {
    psVar2 = sha1_ni_alloc();
    (psVar2->hash).vt = alg;
    psVar2->binarysink_[0].write = sha1_ni_write;
    psVar2->binarysink_[0].writefmtv = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
    psVar2->binarysink_[0].binarysink_ = psVar2->binarysink_;
    (psVar2->hash).binarysink_ = psVar2->binarysink_;
    alg_local = (ssh_hashalg *)&psVar2->hash;
  }
  else {
    alg_local = (ssh_hashalg *)0x0;
  }
  return (ssh_hash *)alg_local;
}

Assistant:

static ssh_hash *sha1_ni_new(const ssh_hashalg *alg)
{
    const struct sha1_extra *extra = (const struct sha1_extra *)alg->extra;
    if (!check_availability(extra))
        return NULL;

    sha1_ni *s = sha1_ni_alloc();

    s->hash.vt = alg;
    BinarySink_INIT(s, sha1_ni_write);
    BinarySink_DELEGATE_INIT(&s->hash, s);
    return &s->hash;
}